

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1c07::RingIndexTest_RingIndexF_Test::TestBody
          (RingIndexTest_RingIndexF_Test *this)

{
  ulong uVar1;
  char *pcVar2;
  AssertHelper local_48;
  RingIndex ret;
  AssertionResult gtest_ar;
  RingIndex local_20;
  
  local_20.idx_max = 0x100;
  local_20.idx = 0;
  ret.idx_max = 0x100;
  ret.idx = 0;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,Sledge::RingIndex>
            ((internal *)&gtest_ar,"ri + ri.get_max()","ri",&ret,&local_20);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ret);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&ret);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_20.idx_max = 0x7fffffffffffffff;
    local_20.idx = 0xa3d70a3d70a3d7;
    ret.idx_max = 0x7fffffffffffffff;
    ret.idx = 0xa3d70a3d70a3ed;
    local_48.data_ = (AssertHelperData *)0xa3d70a3d70a3ed;
    testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
              ((internal *)&gtest_ar,"ri + (max + 22)","ri.get() + 22",&ret,
               (unsigned_long *)&local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&ret);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                 ,0x61,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&ret);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      ret.idx_max = local_20.idx_max;
      uVar1 = 0;
      if (0x7fffffffffff9bc2 < local_20.idx) {
        uVar1 = local_20.idx_max;
      }
      ret.idx = ((local_20.idx + 0x800000000000643d) - uVar1) % local_20.idx_max;
      local_48.data_ = (AssertHelperData *)(local_20.idx + 0x643e);
      testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
                ((internal *)&gtest_ar,"ri + (max + 25662)","ri.get() + 25662",&ret,
                 (unsigned_long *)&local_48);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&ret);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                   ,0x62,pcVar2);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&ret);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        ret.idx_max = local_20.idx_max;
        local_48.data_ = (AssertHelperData *)(local_20.idx + 0x1c5);
        uVar1 = 0;
        if (0xfffffffffffffe3a < local_20.idx) {
          uVar1 = local_20.idx_max;
        }
        ret.idx = ((local_20.idx - uVar1) + 0x1c5) % local_20.idx_max;
        testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
                  ((internal *)&gtest_ar,"ri + 453","ri.get() + 453",&ret,(unsigned_long *)&local_48
                  );
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ret);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                     ,99,pcVar2);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&ret);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_20.idx_max = 0xffffffffffffff2c;
          local_20.idx = 0xd3;
          ret.idx_max = 0xd3;
          testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
                    ((internal *)&gtest_ar,"ri","RingIndex::LIMIT_MAX % ri.get_max()",&local_20,
                     &ret.idx_max);
          if (gtest_ar.success_ != false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_20.idx = 0;
            ret.idx_max = ret.idx_max & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
                      ((internal *)&gtest_ar,"ri","0",&local_20,(int *)&ret);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&ret);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                         ,0x6b,pcVar2);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&ret);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&ret);
            }
            goto LAB_00121f79;
          }
          testing::Message::Message((Message *)&ret);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                     ,0x68,pcVar2);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&ret);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ret);
LAB_00121f79:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST( RingIndexTest, RingIndexF)
	{
		RingIndex ri(0,256);
		ASSERT_EQ( ri + ri.get_max(), ri);
		
		auto max = RingIndex::LIMIT_MAX / 2;
		ri.set_max(max);
		ri.set( max / 200 );  // value much less than max 
		ASSERT_EQ( ri + (max + 22), ri.get() + 22 );
		ASSERT_EQ( ri + (max + 25662), ri.get() + 25662 );
		ASSERT_EQ( ri + 453, ri.get() + 453 );  // no overflow
		
		ri.set_max( RingIndex::LIMIT_MAX - 211 );
		ri = 0; 
		ri += RingIndex::LIMIT_MAX;
		ASSERT_EQ( ri, RingIndex::LIMIT_MAX % ri.get_max() );
		
		ri.set( ri.get_max() );
		ASSERT_EQ( ri, 0 );
	}